

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::VisitArguments(LinTerms *lt,function<void_(int)> *argv)

{
  int *piVar1;
  ArrayRef<int> *in_RSI;
  int v;
  int *__end1;
  int *__begin1;
  ArrayRef<int> *__range1;
  int *piVar2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int *local_48;
  undefined1 local_40 [40];
  undefined1 *local_18;
  
  LinTerms::vars((LinTerms *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_18 = local_40;
  local_48 = ArrayRef<int>::begin((ArrayRef<int> *)0x50bf04);
  piVar1 = ArrayRef<int>::end(in_RSI);
  piVar2 = piVar1;
  for (; local_48 != piVar1; local_48 = local_48 + 1) {
    std::function<void_(int)>::operator()
              ((function<void_(int)> *)in_RSI,(int)((ulong)piVar2 >> 0x20));
  }
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x50bf44);
  return;
}

Assistant:

void VisitArguments(const LinTerms& lt, std::function<void (int)> argv) {
  for (auto v: lt.vars())
    argv(v);
}